

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O0

int xmlNanoFTPCheckResponse(void *ctx)

{
  int iVar1;
  int iVar2;
  fd_set *__arr;
  undefined1 auStack_b0 [4];
  uint __i;
  timeval tv;
  fd_set rfd;
  xmlNanoFTPCtxtPtr ctxt;
  void *ctx_local;
  
  if ((ctx == (void *)0x0) || (*(int *)((long)ctx + 0x44) == -1)) {
    ctx_local._4_4_ = -1;
  }
  else {
    _auStack_b0 = 0;
    tv.tv_sec = 0;
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      rfd.__fds_bits[(ulong)__arr._4_4_ - 1] = 0;
    }
    iVar2 = *(int *)((long)ctx + 0x44);
    iVar1 = iVar2;
    if (iVar2 < 0) {
      iVar1 = iVar2 + 0x3f;
    }
    rfd.__fds_bits[(long)(iVar1 >> 6) + -1] =
         rfd.__fds_bits[(long)(iVar1 >> 6) + -1] | 1L << ((ulong)(byte)iVar2 & 0x3f);
    iVar2 = select(*(int *)((long)ctx + 0x44) + 1,(fd_set *)&tv.tv_usec,(fd_set *)0x0,(fd_set *)0x0,
                   (timeval *)auStack_b0);
    if (iVar2 == -1) {
      __xmlIOErr(9,0,"select");
      ctx_local._4_4_ = -1;
    }
    else if (iVar2 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ = xmlNanoFTPReadResponse(ctx);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int
xmlNanoFTPCheckResponse(void *ctx) {
    xmlNanoFTPCtxtPtr ctxt = (xmlNanoFTPCtxtPtr) ctx;
    fd_set rfd;
    struct timeval tv;

    if ((ctxt == NULL) || (ctxt->controlFd == INVALID_SOCKET)) return(-1);
    tv.tv_sec = 0;
    tv.tv_usec = 0;
    FD_ZERO(&rfd);
    FD_SET(ctxt->controlFd, &rfd);
    switch(select(ctxt->controlFd + 1, &rfd, NULL, NULL, &tv)) {
	case 0:
	    return(0);
	case -1:
	    __xmlIOErr(XML_FROM_FTP, 0, "select");
	    return(-1);

    }

    return(xmlNanoFTPReadResponse(ctx));
}